

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestNode *pTVar1;
  MaskProportionalityCase *this_00;
  TestCaseGroup *group;
  MultisampleTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "default_framebuffer","Test with default framebuffer");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar1 = (TestNode *)operator_new(0x78);
  Functional::anon_unknown_0::SamplePosQueryCase::SamplePosQueryCase
            ((SamplePosQueryCase *)pTVar1,(this->super_TestCaseGroup).m_context,"sample_position",
             "test SAMPLE_POSITION");
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb8);
  Functional::anon_unknown_0::MaskInvertCase::MaskInvertCase
            ((MaskInvertCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "sample_mask_sum_of_inverses",
             "Test that mask and its negation\'s sum equal the fully set mask");
  tcu::TestNode::addChild(node,pTVar1);
  this_00 = (MaskProportionalityCase *)operator_new(0xc0);
  Functional::anon_unknown_0::MaskProportionalityCase::MaskProportionalityCase
            (this_00,(this->super_TestCaseGroup).m_context,"proportionality_sample_mask",
             "Test the proportionality property of GL_SAMPLE_MASK");
  tcu::TestNode::addChild(node,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0xb8);
  Functional::anon_unknown_0::MaskConstancyCase::MaskConstancyCase
            ((MaskConstancyCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "constancy_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_MASK"
             ,8);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb8);
  Functional::anon_unknown_0::MaskConstancyCase::MaskConstancyCase
            ((MaskConstancyCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "constancy_alpha_to_coverage_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_MASK"
             ,9);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb8);
  Functional::anon_unknown_0::MaskConstancyCase::MaskConstancyCase
            ((MaskConstancyCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "constancy_sample_coverage_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK"
             ,10);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb8);
  Functional::anon_unknown_0::MaskConstancyCase::MaskConstancyCase
            ((MaskConstancyCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "constancy_alpha_to_coverage_sample_coverage_sample_mask",
             "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE, GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK"
             ,0xb);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xb8);
  Functional::anon_unknown_0::SampleMaskHighBitsCase::SampleMaskHighBitsCase
            ((SampleMaskHighBitsCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "sample_mask_non_effective_bits",
             "Test that values of unused bits of a sample mask (bit index > sample count) have no effect"
            );
  tcu::TestNode::addChild(node,pTVar1);
  return extraout_EAX;
}

Assistant:

void MultisampleTests::init (void)
{
	tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "default_framebuffer", "Test with default framebuffer");

	addChild(group);

	// .default_framebuffer
	{
		// sample positions
		group->addChild(new SamplePosQueryCase			(m_context, "sample_position", "test SAMPLE_POSITION"));

		// sample mask
		group->addChild(new MaskInvertCase				(m_context, "sample_mask_sum_of_inverses",	"Test that mask and its negation's sum equal the fully set mask"));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_mask",	"Test the proportionality property of GL_SAMPLE_MASK"));

		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_ALPHA_TO_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_SAMPLE_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage_sample_coverage_sample_mask",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE, GL_SAMPLE_COVERAGE and GL_SAMPLE_MASK",
																	MaskConstancyCase::CASEBIT_ALPHA_TO_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_COVERAGE | MaskConstancyCase::CASEBIT_SAMPLE_MASK));
		group->addChild(new SampleMaskHighBitsCase		(m_context, "sample_mask_non_effective_bits",
																	"Test that values of unused bits of a sample mask (bit index > sample count) have no effect"));
	}
}